

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O0

ostream * operator<<(ostream *os,Bytes *in)

{
  Bytes *pBVar1;
  bool bVar2;
  string local_40;
  Span<const_unsigned_char> *local_20;
  Bytes *in_local;
  ostream *os_local;
  
  local_20 = &in->span_;
  in_local = (Bytes *)os;
  bVar2 = bssl::Span<const_unsigned_char>::empty(&in->span_);
  pBVar1 = in_local;
  if (bVar2) {
    os_local = std::operator<<((ostream *)in_local,"<empty Bytes>");
  }
  else {
    EncodeHex_abi_cxx11_(&local_40,*local_20);
    std::operator<<((ostream *)pBVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    os_local = (ostream *)in_local;
  }
  return os_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Bytes &in) {
  if (in.span_.empty()) {
    return os << "<empty Bytes>";
  }

  // Print a byte slice as hex.
  os << EncodeHex(in.span_);
  return os;
}